

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

UCollationResult __thiscall
icu_63::RuleBasedCollator::doCompare
          (RuleBasedCollator *this,UChar *left,int32_t leftLength,UChar *right,int32_t rightLength,
          UErrorCode *errorCode)

{
  Normalizer2Impl *nfcImpl;
  byte numeric;
  UBool UVar1;
  UCollationResult UVar2;
  ulong uVar3;
  CollationSettings *pCVar4;
  int32_t leftLength_00;
  int rightLength_00;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  UChar *pUVar8;
  UChar *local_478;
  UChar *local_470;
  UTF16CollationIterator rightIter;
  UTF16CollationIterator leftIter;
  
  if (left == right && leftLength == rightLength) {
    return UCOL_EQUAL;
  }
  if (leftLength < 0) {
    for (uVar7 = 0; left[uVar7] == right[uVar7]; uVar7 = uVar7 + 1) {
      if (left[uVar7] == L'\0') {
        return UCOL_EQUAL;
      }
    }
    local_470 = (UChar *)0x0;
    local_478 = (UChar *)0x0;
  }
  else {
    uVar7 = (ulong)(uint)leftLength;
    local_478 = left + uVar7;
    local_470 = right + rightLength;
    for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      if ((uint)rightLength == uVar3) {
        uVar7 = (ulong)(uint)rightLength;
        goto LAB_0021b386;
      }
      if (left[uVar3] != right[uVar3]) {
        uVar7 = uVar3 & 0xffffffff;
        goto LAB_0021b386;
      }
    }
    if (leftLength == rightLength) {
      return UCOL_EQUAL;
    }
  }
LAB_0021b386:
  numeric = (byte)this->settings->options >> 1 & 1;
  uVar6 = (uint)uVar7;
  if (uVar6 == 0) {
LAB_0021b427:
    uVar5 = 0;
  }
  else if (((uVar6 != leftLength) &&
           (UVar1 = CollationData::isUnsafeBackward
                              (this->data,(uint)(ushort)left[uVar7 & 0xffffffff],numeric),
           UVar1 != '\0')) ||
          ((uVar5 = rightLength, uVar6 != rightLength &&
           (UVar1 = CollationData::isUnsafeBackward
                              (this->data,(uint)(ushort)right[uVar7 & 0xffffffff],numeric),
           uVar5 = uVar6, UVar1 != '\0')))) {
    pUVar8 = left + (uVar6 - 1);
    uVar7 = uVar7 & 0xffffffff;
    do {
      if ((int)uVar7 < 2) goto LAB_0021b427;
      UVar1 = CollationData::isUnsafeBackward(this->data,(uint)(ushort)*pUVar8,numeric);
      uVar5 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar5;
      pUVar8 = pUVar8 + -1;
    } while (UVar1 != '\0');
  }
  pCVar4 = this->settings;
  if (((-1 < pCVar4->fastLatinOptions) &&
      ((leftLength_00 = leftLength - uVar5, leftLength_00 == 0 || ((ushort)left[(int)uVar5] < 0x180)
       ))) && ((rightLength_00 = rightLength - uVar5, rightLength_00 == 0 ||
               ((ushort)right[(int)uVar5] < 0x180)))) {
    if (leftLength < 0) {
      rightLength_00 = -1;
      leftLength_00 = -1;
    }
    UVar2 = CollationFastLatin::compareUTF16
                      (this->data->fastLatinTable,pCVar4->fastLatinPrimaries,
                       pCVar4->fastLatinOptions,left + (int)uVar5,leftLength_00,right + (int)uVar5,
                       rightLength_00);
    if (UVar2 != ~UCOL_GREATER) goto LAB_0021b59b;
    pCVar4 = this->settings;
  }
  if ((pCVar4->options & 1) == 0) {
    UTF16CollationIterator::UTF16CollationIterator
              (&leftIter,this->data,numeric,left,left + (int)uVar5,local_478);
    UTF16CollationIterator::UTF16CollationIterator
              (&rightIter,this->data,numeric,right,right + (int)uVar5,local_470);
    UVar2 = CollationCompare::compareUpToQuaternary
                      (&leftIter.super_CollationIterator,&rightIter.super_CollationIterator,
                       this->settings,errorCode);
    UTF16CollationIterator::~UTF16CollationIterator(&rightIter);
    UTF16CollationIterator::~UTF16CollationIterator(&leftIter);
  }
  else {
    FCDUTF16CollationIterator::FCDUTF16CollationIterator
              ((FCDUTF16CollationIterator *)&leftIter,this->data,numeric,left,left + (int)uVar5,
               local_478);
    FCDUTF16CollationIterator::FCDUTF16CollationIterator
              ((FCDUTF16CollationIterator *)&rightIter,this->data,numeric,right,right + (int)uVar5,
               local_470);
    UVar2 = CollationCompare::compareUpToQuaternary
                      (&leftIter.super_CollationIterator,&rightIter.super_CollationIterator,
                       this->settings,errorCode);
    FCDUTF16CollationIterator::~FCDUTF16CollationIterator((FCDUTF16CollationIterator *)&rightIter);
    FCDUTF16CollationIterator::~FCDUTF16CollationIterator((FCDUTF16CollationIterator *)&leftIter);
  }
LAB_0021b59b:
  if (UVar2 == UCOL_EQUAL) {
    uVar6 = this->settings->options;
    UVar2 = UCOL_EQUAL;
    if ((0xefff < (int)uVar6) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
      nfcImpl = this->data->nfcImpl;
      leftIter.super_CollationIterator.ceBuffer.buffer.ptr = (long *)(left + (int)uVar5);
      if ((uVar6 & 1) == 0) {
        leftIter.super_CollationIterator.ceBuffer.length = -1;
        leftIter.super_CollationIterator.ceBuffer._4_4_ = 0;
        leftIter.super_CollationIterator.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UObject_0039a950;
        leftIter.super_CollationIterator.ceBuffer.buffer._8_8_ = local_478;
        rightIter.super_CollationIterator.ceBuffer.length = -1;
        rightIter.super_CollationIterator.ceBuffer._4_4_ = 0;
        rightIter.super_CollationIterator.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UObject_0039a950;
        rightIter.super_CollationIterator.ceBuffer.buffer._8_8_ = local_470;
        rightIter.super_CollationIterator.ceBuffer.buffer.ptr = (long *)(right + (int)uVar5);
        UVar2 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)&leftIter,(NFDIterator *)&rightIter);
        UObject::~UObject((UObject *)&rightIter);
        UObject::~UObject((UObject *)&leftIter);
      }
      else {
        anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
                  ((FCDUTF16NFDIterator *)&leftIter,nfcImpl,
                   (UChar *)leftIter.super_CollationIterator.ceBuffer.buffer.ptr,local_478);
        anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
                  ((FCDUTF16NFDIterator *)&rightIter,nfcImpl,right + (int)uVar5,local_470);
        UVar2 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)&leftIter,(NFDIterator *)&rightIter);
        anon_unknown_16::FCDUTF16NFDIterator::~FCDUTF16NFDIterator
                  ((FCDUTF16NFDIterator *)&rightIter);
        anon_unknown_16::FCDUTF16NFDIterator::~FCDUTF16NFDIterator((FCDUTF16NFDIterator *)&leftIter)
        ;
      }
    }
  }
  return UVar2;
}

Assistant:

UCollationResult
RuleBasedCollator::doCompare(const UChar *left, int32_t leftLength,
                             const UChar *right, int32_t rightLength,
                             UErrorCode &errorCode) const {
    // U_FAILURE(errorCode) checked by caller.
    if(left == right && leftLength == rightLength) {
        return UCOL_EQUAL;
    }

    // Identical-prefix test.
    const UChar *leftLimit;
    const UChar *rightLimit;
    int32_t equalPrefixLength = 0;
    if(leftLength < 0) {
        leftLimit = NULL;
        rightLimit = NULL;
        UChar c;
        while((c = left[equalPrefixLength]) == right[equalPrefixLength]) {
            if(c == 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }
    } else {
        leftLimit = left + leftLength;
        rightLimit = right + rightLength;
        for(;;) {
            if(equalPrefixLength == leftLength) {
                if(equalPrefixLength == rightLength) { return UCOL_EQUAL; }
                break;
            } else if(equalPrefixLength == rightLength ||
                      left[equalPrefixLength] != right[equalPrefixLength]) {
                break;
            }
            ++equalPrefixLength;
        }
    }

    UBool numeric = settings->isNumeric();
    if(equalPrefixLength > 0) {
        if((equalPrefixLength != leftLength &&
                    data->isUnsafeBackward(left[equalPrefixLength], numeric)) ||
                (equalPrefixLength != rightLength &&
                    data->isUnsafeBackward(right[equalPrefixLength], numeric))) {
            // Identical prefix: Back up to the start of a contraction or reordering sequence.
            while(--equalPrefixLength > 0 &&
                    data->isUnsafeBackward(left[equalPrefixLength], numeric)) {}
        }
        // Notes:
        // - A longer string can compare equal to a prefix of it if only ignorables follow.
        // - With a backward level, a longer string can compare less-than a prefix of it.

        // Pass the actual start of each string into the CollationIterators,
        // plus the equalPrefixLength position,
        // so that prefix matches back into the equal prefix work.
    }

    int32_t result;
    int32_t fastLatinOptions = settings->fastLatinOptions;
    if(fastLatinOptions >= 0 &&
            (equalPrefixLength == leftLength ||
                left[equalPrefixLength] <= CollationFastLatin::LATIN_MAX) &&
            (equalPrefixLength == rightLength ||
                right[equalPrefixLength] <= CollationFastLatin::LATIN_MAX)) {
        if(leftLength >= 0) {
            result = CollationFastLatin::compareUTF16(data->fastLatinTable,
                                                      settings->fastLatinPrimaries,
                                                      fastLatinOptions,
                                                      left + equalPrefixLength,
                                                      leftLength - equalPrefixLength,
                                                      right + equalPrefixLength,
                                                      rightLength - equalPrefixLength);
        } else {
            result = CollationFastLatin::compareUTF16(data->fastLatinTable,
                                                      settings->fastLatinPrimaries,
                                                      fastLatinOptions,
                                                      left + equalPrefixLength, -1,
                                                      right + equalPrefixLength, -1);
        }
    } else {
        result = CollationFastLatin::BAIL_OUT_RESULT;
    }

    if(result == CollationFastLatin::BAIL_OUT_RESULT) {
        if(settings->dontCheckFCD()) {
            UTF16CollationIterator leftIter(data, numeric,
                                            left, left + equalPrefixLength, leftLimit);
            UTF16CollationIterator rightIter(data, numeric,
                                            right, right + equalPrefixLength, rightLimit);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        } else {
            FCDUTF16CollationIterator leftIter(data, numeric,
                                              left, left + equalPrefixLength, leftLimit);
            FCDUTF16CollationIterator rightIter(data, numeric,
                                                right, right + equalPrefixLength, rightLimit);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        }
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return (UCollationResult)result;
    }

    // Note: If NUL-terminated, we could get the actual limits from the iterators now.
    // That would complicate the iterators a bit, NUL-terminated strings are only a C convenience,
    // and the benefit seems unlikely to be measurable.

    // Compare identical level.
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    left += equalPrefixLength;
    right += equalPrefixLength;
    if(settings->dontCheckFCD()) {
        UTF16NFDIterator leftIter(left, leftLimit);
        UTF16NFDIterator rightIter(right, rightLimit);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUTF16NFDIterator leftIter(nfcImpl, left, leftLimit);
        FCDUTF16NFDIterator rightIter(nfcImpl, right, rightLimit);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}